

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdbmp.c
# Opt level: O2

cjpeg_source_ptr jinit_read_bmp(j_compress_ptr cinfo,boolean use_inversion_array)

{
  cjpeg_source_ptr pcVar1;
  
  pcVar1 = (cjpeg_source_ptr)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x68);
  pcVar1[1].start_input = (_func_void_j_compress_ptr_cjpeg_source_ptr *)cinfo;
  pcVar1->start_input = start_input_bmp;
  pcVar1->finish_input = finish_input_bmp;
  pcVar1[1].buffer_height = use_inversion_array;
  return pcVar1;
}

Assistant:

GLOBAL(cjpeg_source_ptr)
jinit_read_bmp(j_compress_ptr cinfo, boolean use_inversion_array)
{
  bmp_source_ptr source;

  /* Create module interface object */
  source = (bmp_source_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(bmp_source_struct));
  source->cinfo = cinfo;        /* make back link for subroutines */
  /* Fill in method ptrs, except get_pixel_rows which start_input sets */
  source->pub.start_input = start_input_bmp;
  source->pub.finish_input = finish_input_bmp;
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
  source->pub.max_pixels = 0;
#endif

  source->use_inversion_array = use_inversion_array;

  return (cjpeg_source_ptr)source;
}